

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O1

bool __thiscall
cmParseGTMCoverage::FindFunctionInMumpsFile
          (cmParseGTMCoverage *this,string *filepath,string *function,int *lineoffset)

{
  byte bVar1;
  cmCTest *this_00;
  bool bVar2;
  string *psVar3;
  cmParseGTMCoverage *pcVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  string line;
  ostringstream cmCTestLog_msg;
  ifstream in;
  string local_400;
  string *local_3e0;
  cmParseGTMCoverage *local_3d8;
  long *local_3d0;
  long local_3c0 [2];
  undefined1 local_3b0 [376];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(filepath->_M_dataplus)._M_p,_S_in);
  iVar8 = 0;
  bVar5 = false;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    local_400._M_string_length = 0;
    local_400.field_2._M_local_buf[0] = '\0';
    local_3e0 = filepath;
    local_3d8 = this;
    do {
      bVar5 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)local_238,&local_400,(bool *)0x0,0xffffffffffffffff);
      if (!bVar5) {
        *lineoffset = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Could not find entry point : ",0x1d);
        pcVar4 = local_3d8;
        psVar3 = local_3e0;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3b0,(function->_M_dataplus)._M_p,
                            function->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," in ",4);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        this_00 = (pcVar4->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                     ,0x9c,(char *)local_3d0,false);
        if (local_3d0 != local_3c0) {
          operator_delete(local_3d0,local_3c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base((ios_base *)(local_3b0 + 0x70));
        break;
      }
      lVar6 = std::__cxx11::string::find((char *)&local_400,(ulong)(function->_M_dataplus)._M_p,0);
      if (lVar6 == 1) {
        if ((*local_400._M_dataplus._M_p != '%') ||
           ((local_400._M_dataplus._M_p[function->_M_string_length + 1] & 0xf7U) != 0x20))
        goto LAB_001be059;
        *lineoffset = iVar8;
LAB_001be055:
        bVar2 = false;
      }
      else {
        if (lVar6 == 0) {
          bVar1 = local_400._M_dataplus._M_p[function->_M_string_length];
          if (((ulong)bVar1 < 0x29) && ((0x10100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
            *lineoffset = iVar8;
            if ((bVar1 < 0x29) && ((0x10100000200U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0))
            goto LAB_001be055;
          }
        }
LAB_001be059:
        iVar8 = iVar8 + 1;
        bVar2 = true;
      }
    } while (bVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,
                      CONCAT71(local_400.field_2._M_allocated_capacity._1_7_,
                               local_400.field_2._M_local_buf[0]) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return bVar5;
}

Assistant:

bool cmParseGTMCoverage::FindFunctionInMumpsFile(std::string const& filepath,
                                                 std::string const& function,
                                                 int& lineoffset)
{
  cmsys::ifstream in(filepath.c_str());
  if (!in) {
    return false;
  }
  std::string line;
  int linenum = 0;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    std::string::size_type pos = line.find(function);
    if (pos == 0) {
      char nextchar = line[function.size()];
      if (nextchar == ' ' || nextchar == '(' || nextchar == '\t') {
        lineoffset = linenum;
        return true;
      }
    }
    if (pos == 1) {
      char prevchar = line[0];
      char nextchar = line[function.size() + 1];
      if (prevchar == '%' && (nextchar == ' ' || nextchar == '(')) {
        lineoffset = linenum;
        return true;
      }
    }
    linenum++; // move to next line count
  }
  lineoffset = 0;
  cmCTestLog(this->CTest, ERROR_MESSAGE,
             "Could not find entry point : " << function << " in " << filepath
                                             << "\n");
  return false;
}